

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_145302::ClangShellCommand::configureAttribute
          (ClangShellCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  ArrayRef<llvm::StringRef> values_00;
  StringRef name_00;
  int iVar1;
  size_t __n;
  BuildFileDelegate *pBVar2;
  undefined4 extraout_var;
  bool local_159;
  StringRef local_110;
  char *local_100;
  StringRef arg;
  iterator __end3;
  iterator __begin3;
  ArrayRef<llvm::StringRef> *__range3;
  char *local_c8;
  size_t local_c0;
  ConfigureContext *local_b8;
  ConfigureContext *ctx_local;
  ClangShellCommand *this_local;
  ArrayRef<llvm::StringRef> values_local;
  StringRef name_local;
  char *local_60;
  size_t local_58;
  char **local_50;
  ArrayRef<llvm::StringRef> *local_48;
  size_t local_40;
  size_t local_38;
  ArrayRef<llvm::StringRef> *local_30;
  char *local_28;
  int local_1c;
  char *local_18;
  ArrayRef<llvm::StringRef> **local_10;
  
  values_local.Data = (StringRef *)values.Length;
  this_local = (ClangShellCommand *)values.Data;
  local_c8 = name.Data;
  local_10 = &__range3;
  local_18 = "args";
  __range3 = (ArrayRef<llvm::StringRef> *)0x31fd87;
  local_c0 = name.Length;
  local_b8 = ctx;
  ctx_local = (ConfigureContext *)this;
  values_local.Length = (size_type)local_c8;
  local_40 = strlen("args");
  local_60 = local_c8;
  local_58 = local_c0;
  local_48 = __range3;
  local_50 = &local_60;
  local_159 = false;
  if (local_c0 == local_40) {
    local_28 = local_c8;
    local_30 = __range3;
    local_38 = local_40;
    if (local_40 == 0) {
      local_1c = 0;
    }
    else {
      local_1c = memcmp(local_c8,__range3,local_40);
    }
    local_159 = local_1c == 0;
  }
  if (local_159) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::clear(&this->args);
    __n = llvm::ArrayRef<llvm::StringRef>::size((ArrayRef<llvm::StringRef> *)&this_local);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::reserve(&this->args,__n);
    __end3 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
    arg.Length = (size_t)llvm::ArrayRef<llvm::StringRef>::end
                                   ((ArrayRef<llvm::StringRef> *)&this_local);
    for (; __end3 != (iterator)arg.Length; __end3 = __end3 + 1) {
      local_100 = __end3->Data;
      arg.Data = (char *)__end3->Length;
      pBVar2 = llbuild::buildsystem::ConfigureContext::getDelegate(local_b8);
      iVar1 = (*pBVar2->_vptr_BuildFileDelegate[2])(pBVar2,local_100,arg.Data);
      local_110.Data = (char *)CONCAT44(extraout_var,iVar1);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (&this->args,&local_110);
    }
    name_local.Length._7_1_ = true;
  }
  else {
    name_00.Length = name.Length;
    name_00.Data = (char *)values_local.Length;
    values_00.Length = (size_type)values_local.Data;
    values_00.Data = (StringRef *)this_local;
    name_local.Length._7_1_ =
         llbuild::buildsystem::ExternalCommand::configureAttribute
                   (&this->super_ExternalCommand,local_b8,name_00,values_00);
  }
  return name_local.Length._7_1_;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (name == "args") {
      args.clear();
      args.reserve(values.size());
      for (auto arg: values) {
        args.emplace_back(ctx.getDelegate().getInternedString(arg));
      }
    } else {
        return ExternalCommand::configureAttribute(ctx, name, values);
    }

    return true;
  }